

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_self_test(int verbose)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  ulong uVar5;
  bool bVar6;
  mbedtls_mpi X;
  mbedtls_mpi U;
  mbedtls_mpi N;
  mbedtls_mpi A;
  mbedtls_mpi Y;
  mbedtls_mpi V;
  mbedtls_mpi E;
  
  uVar3 = 1;
  A.n = 0;
  A.p = (mbedtls_mpi_uint *)0x0;
  E.n = 0;
  E.p = (mbedtls_mpi_uint *)0x0;
  N.n = 0;
  N.p = (mbedtls_mpi_uint *)0x0;
  X.n = 0;
  X.p = (mbedtls_mpi_uint *)0x0;
  Y.n = 0;
  Y.p = (mbedtls_mpi_uint *)0x0;
  U.n = 0;
  U.p = (mbedtls_mpi_uint *)0x0;
  V.n = 0;
  V.p = (mbedtls_mpi_uint *)0x0;
  X.s = uVar3;
  U.s = uVar3;
  N.s = uVar3;
  A.s = uVar3;
  Y.s = uVar3;
  V.s = uVar3;
  E.s = uVar3;
  uVar1 = mbedtls_mpi_read_string
                    (&A,0x10,
                     "EFE021C2645FD1DC586E69184AF4A31ED5F53E93B5F123FA41680867BA110131944FE7952E2517337780CB0DB80E61AAE7C8DDC6C5C6AADEB34EB38A2F40D5E6"
                    );
  if (uVar1 == 0) {
    uVar1 = mbedtls_mpi_read_string
                      (&E,0x10,
                       "B2E7EFD37075B9F03FF989C7C5051C2034D2A323810251127E7BF8625A4F49A5F3E27F4DA8BD59C47D6DAABA4C8127BD5B5C25763222FEFCCFC38B832366C29E"
                      );
    if (uVar1 != 0) goto LAB_00112e0f;
    uVar1 = mbedtls_mpi_read_string
                      (&N,0x10,
                       "0066A198186C18C10B2F5ED9B522752A9830B69916E535C8F047518A889A43A594B6BED27A168D31D4A52F88925AA8F5"
                      );
    if (uVar1 != 0) goto LAB_00112e0f;
    uVar1 = mbedtls_mpi_mul_mpi(&X,&A,&N);
    if (uVar1 != 0) goto LAB_00112e0f;
    uVar1 = mbedtls_mpi_read_string
                      (&U,0x10,
                       "602AB7ECA597A3D6B56FF9829A5E8B859E857EA95A03512E2BAE7391688D264AA5663B0341DB9CCFD2C4C5F421FEC8148001B72E848A38CAE1C65F78E56ABDEFE12D3C039B8A02D6BE593F0BBBDA56F1ECF677152EF804370C1A305CAF3B5BF130879B56C61DE584A0F53A2447A51E"
                      );
    if (uVar1 != 0) goto LAB_00112e0f;
    if (verbose != 0) {
      printf("  MPI test #1 (mul_mpi): ");
    }
    iVar2 = mbedtls_mpi_cmp_mpi(&X,&U);
    if (iVar2 != 0) goto LAB_00112eb7;
    if (verbose != 0) {
      puts("passed");
    }
    uVar1 = mbedtls_mpi_div_mpi(&X,&Y,&A,&N);
    if (uVar1 != 0) goto LAB_00112e0f;
    uVar1 = mbedtls_mpi_read_string(&U,0x10,"256567336059E52CAE22925474705F39A94");
    if (uVar1 != 0) goto LAB_00112e0f;
    uVar1 = mbedtls_mpi_read_string
                      (&V,0x10,
                       "6613F26162223DF488E9CD48CC132C7A0AC93C701B001B092E4E5B9F73BCD27B9EE50D0657C77F374E903CDFA4C642"
                      );
    if (uVar1 != 0) goto LAB_00112e0f;
    if (verbose != 0) {
      printf("  MPI test #2 (div_mpi): ");
    }
    iVar2 = mbedtls_mpi_cmp_mpi(&X,&U);
    if (iVar2 == 0) {
      iVar2 = mbedtls_mpi_cmp_mpi(&Y,&V);
      if (iVar2 != 0) goto LAB_00112eb7;
      if (verbose != 0) {
        puts("passed");
      }
      uVar1 = mbedtls_mpi_exp_mod(&X,&A,&E,&N,(mbedtls_mpi *)0x0);
      if (uVar1 != 0) goto LAB_00112e0f;
      uVar1 = mbedtls_mpi_read_string
                        (&U,0x10,
                         "36E139AEA55215609D2816998ED020BBBD96C37890F65171D948E9BC7CBAA4D9325D24D6A3C12710F10A09FA08AB87"
                        );
      if (uVar1 != 0) goto LAB_00112e0f;
      if (verbose != 0) {
        printf("  MPI test #3 (exp_mod): ");
      }
      iVar2 = mbedtls_mpi_cmp_mpi(&X,&U);
      if (iVar2 != 0) goto LAB_00112eb7;
      if (verbose != 0) {
        puts("passed");
      }
      uVar1 = mbedtls_mpi_inv_mod(&X,&A,&N);
      if (uVar1 != 0) goto LAB_00112e0f;
      uVar1 = mbedtls_mpi_read_string
                        (&U,0x10,
                         "003A0AAEDD7E784FC07D8F9EC6E3BFD5C3DBA76456363A10869622EAC2DD84ECC5B8A74DAC4D09E03B5E0BE779F2DF61"
                        );
      if (uVar1 != 0) goto LAB_00112e0f;
      if (verbose != 0) {
        printf("  MPI test #4 (inv_mod): ");
      }
      iVar2 = mbedtls_mpi_cmp_mpi(&X,&U);
      if (iVar2 != 0) goto LAB_00112eb7;
      if (verbose != 0) {
        puts("passed");
        printf("  MPI test #5 (simple gcd): ");
      }
      piVar4 = gcd_pairs[0] + 2;
      for (uVar5 = 0; uVar5 != 3; uVar5 = uVar5 + 1) {
        uVar1 = mbedtls_mpi_lset(&X,(long)(*(int (*) [3])(piVar4 + -2))[0]);
        if (uVar1 != 0) goto LAB_00112e0f;
        uVar1 = mbedtls_mpi_lset(&Y,(long)piVar4[-1]);
        if (uVar1 != 0) goto LAB_00112e0f;
        uVar1 = mbedtls_mpi_gcd(&A,&X,&Y);
        if (uVar1 != 0) goto LAB_00112e0f;
        iVar2 = mbedtls_mpi_cmp_int(&A,(long)*piVar4);
        if (iVar2 != 0) {
          uVar1 = uVar3;
          if (verbose == 0) goto LAB_0011311c;
          printf("failed at %d\n",uVar5 & 0xffffffff);
          goto LAB_00112ecb;
        }
        piVar4 = piVar4 + 3;
      }
      uVar1 = 0;
      if (verbose != 0) {
        puts("passed");
        uVar1 = 0;
      }
LAB_0011311c:
      bVar6 = verbose != 0;
      goto LAB_00112e2c;
    }
LAB_00112eb7:
    uVar1 = uVar3;
    if (verbose == 0) goto LAB_0011311c;
    puts("failed");
LAB_00112ecb:
    uVar1 = 1;
  }
  else {
LAB_00112e0f:
    if (verbose == 0) {
      bVar6 = false;
      goto LAB_00112e2c;
    }
  }
  printf("Unexpected error, return code = %08X\n",(ulong)uVar1);
  bVar6 = true;
LAB_00112e2c:
  mbedtls_mpi_free(&A);
  mbedtls_mpi_free(&E);
  mbedtls_mpi_free(&N);
  mbedtls_mpi_free(&X);
  mbedtls_mpi_free(&Y);
  mbedtls_mpi_free(&U);
  mbedtls_mpi_free(&V);
  if (bVar6) {
    putchar(10);
  }
  return uVar1;
}

Assistant:

int mbedtls_mpi_self_test( int verbose )
{
    int ret, i;
    mbedtls_mpi A, E, N, X, Y, U, V;

    mbedtls_mpi_init( &A ); mbedtls_mpi_init( &E ); mbedtls_mpi_init( &N ); mbedtls_mpi_init( &X );
    mbedtls_mpi_init( &Y ); mbedtls_mpi_init( &U ); mbedtls_mpi_init( &V );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &A, 16,
        "EFE021C2645FD1DC586E69184AF4A31E" \
        "D5F53E93B5F123FA41680867BA110131" \
        "944FE7952E2517337780CB0DB80E61AA" \
        "E7C8DDC6C5C6AADEB34EB38A2F40D5E6" ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &E, 16,
        "B2E7EFD37075B9F03FF989C7C5051C20" \
        "34D2A323810251127E7BF8625A4F49A5" \
        "F3E27F4DA8BD59C47D6DAABA4C8127BD" \
        "5B5C25763222FEFCCFC38B832366C29E" ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &N, 16,
        "0066A198186C18C10B2F5ED9B522752A" \
        "9830B69916E535C8F047518A889A43A5" \
        "94B6BED27A168D31D4A52F88925AA8F5" ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &X, &A, &N ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &U, 16,
        "602AB7ECA597A3D6B56FF9829A5E8B85" \
        "9E857EA95A03512E2BAE7391688D264A" \
        "A5663B0341DB9CCFD2C4C5F421FEC814" \
        "8001B72E848A38CAE1C65F78E56ABDEF" \
        "E12D3C039B8A02D6BE593F0BBBDA56F1" \
        "ECF677152EF804370C1A305CAF3B5BF1" \
        "30879B56C61DE584A0F53A2447A51E" ) );

    if( verbose != 0 )
        mbedtls_printf( "  MPI test #1 (mul_mpi): " );

    if( mbedtls_mpi_cmp_mpi( &X, &U ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    MBEDTLS_MPI_CHK( mbedtls_mpi_div_mpi( &X, &Y, &A, &N ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &U, 16,
        "256567336059E52CAE22925474705F39A94" ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &V, 16,
        "6613F26162223DF488E9CD48CC132C7A" \
        "0AC93C701B001B092E4E5B9F73BCD27B" \
        "9EE50D0657C77F374E903CDFA4C642" ) );

    if( verbose != 0 )
        mbedtls_printf( "  MPI test #2 (div_mpi): " );

    if( mbedtls_mpi_cmp_mpi( &X, &U ) != 0 ||
        mbedtls_mpi_cmp_mpi( &Y, &V ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &X, &A, &E, &N, NULL ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &U, 16,
        "36E139AEA55215609D2816998ED020BB" \
        "BD96C37890F65171D948E9BC7CBAA4D9" \
        "325D24D6A3C12710F10A09FA08AB87" ) );

    if( verbose != 0 )
        mbedtls_printf( "  MPI test #3 (exp_mod): " );

    if( mbedtls_mpi_cmp_mpi( &X, &U ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &X, &A, &N ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &U, 16,
        "003A0AAEDD7E784FC07D8F9EC6E3BFD5" \
        "C3DBA76456363A10869622EAC2DD84EC" \
        "C5B8A74DAC4D09E03B5E0BE779F2DF61" ) );

    if( verbose != 0 )
        mbedtls_printf( "  MPI test #4 (inv_mod): " );

    if( mbedtls_mpi_cmp_mpi( &X, &U ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
        mbedtls_printf( "  MPI test #5 (simple gcd): " );

    for( i = 0; i < GCD_PAIR_COUNT; i++ )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &X, gcd_pairs[i][0] ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &Y, gcd_pairs[i][1] ) );

        MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( &A, &X, &Y ) );

        if( mbedtls_mpi_cmp_int( &A, gcd_pairs[i][2] ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed at %d\n", i );

            ret = 1;
            goto cleanup;
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

cleanup:

    if( ret != 0 && verbose != 0 )
        mbedtls_printf( "Unexpected error, return code = %08X\n", ret );

    mbedtls_mpi_free( &A ); mbedtls_mpi_free( &E ); mbedtls_mpi_free( &N ); mbedtls_mpi_free( &X );
    mbedtls_mpi_free( &Y ); mbedtls_mpi_free( &U ); mbedtls_mpi_free( &V );

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( ret );
}